

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueCase::verifySampleBuffers
          (SampleMaskUniqueCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  TestLog *pTVar5;
  size_type sVar6;
  MessageBuilder *pMVar7;
  reference pvVar8;
  float fVar9;
  bool local_1191;
  bool local_1189;
  ConstPixelBufferAccess local_1098;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  LogImage local_1020;
  allocator<char> local_f89;
  string local_f88;
  allocator<char> local_f61;
  string local_f60;
  LogImageSet local_f40;
  MessageBuilder local_f00;
  int local_d7c;
  MessageBuilder local_d78;
  deUint32 local_bf4;
  MessageBuilder local_bf0;
  int local_a6c;
  int local_a68;
  int sampleNdxB;
  int sampleNdxA;
  RGBA color;
  int sampleNdx_2;
  int iStack_a54;
  bool maskNdxNotUnique;
  int x;
  int y;
  Vector<float,_4> local_8d0;
  PixelBufferAccess local_8c0;
  allocator<int> local_891;
  undefined1 local_890 [8];
  vector<int,_std::allocator<int>_> maskBitIndices;
  int local_870;
  int printFloodLimit;
  int printCount;
  bool uniquenessOk;
  Surface errorMask;
  Vector<float,_3> local_844;
  ColorVerifier local_838;
  MessageBuilder local_820;
  MessageBuilder local_6a0;
  Verifier local_520;
  int local_518;
  int local_514;
  MessageBuilder local_510;
  int local_38c;
  undefined1 local_388 [4];
  int sampleNdx_1;
  ConstPixelBufferAccess local_208;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  LogImage local_160;
  int local_d0;
  allocator<char> local_c9;
  int sampleNdx;
  allocator<char> local_91;
  string local_90;
  LogImageSet local_70;
  byte local_29;
  int local_28;
  int iStack_24;
  bool allOk;
  int height;
  int width;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers_local;
  SampleMaskUniqueCase *this_local;
  
  _height = resultBuffers;
  resultBuffers_local = (vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)this;
  pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[](resultBuffers,0);
  iStack_24 = tcu::Surface::getWidth(pvVar4);
  pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[](_height,0);
  local_28 = tcu::Surface::getHeight(pvVar4);
  local_29 = 1;
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"SampleBuffers",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampleNdx,"Image sample buffers",&local_c9);
  tcu::LogImageSet::LogImageSet(&local_70,&local_90,(string *)&sampleNdx);
  tcu::TestLog::operator<<(pTVar5,&local_70);
  tcu::LogImageSet::~LogImageSet(&local_70);
  std::__cxx11::string::~string((string *)&sampleNdx);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  for (local_d0 = 0; iVar3 = local_d0,
      sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
      iVar3 < (int)sVar6; local_d0 = local_d0 + 1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    de::toString<int>(&local_1a0,&local_d0);
    std::operator+(&local_180,"Buffer",&local_1a0);
    de::toString<int>(&local_1e0,&local_d0);
    std::operator+(&local_1c0,"Sample ",&local_1e0);
    pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       (_height,(long)local_d0);
    tcu::Surface::getAccess(&local_208,pvVar4);
    tcu::LogImage::LogImage
              (&local_160,&local_180,&local_1c0,&local_208,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar5,&local_160);
    tcu::LogImage::~LogImage(&local_160);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_388,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_388,
                      (char (*) [73])
                      "Verifying fragment shader invocation found only one set sample mask bit.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_388);
  for (local_38c = 0; iVar3 = local_38c,
      sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
      iVar3 < (int)sVar6; local_38c = local_38c + 1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_510,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_510,(char (*) [18])"Verifying sample ");
    local_514 = local_38c + 1;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_514);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2bb3658);
    sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
    local_518 = (int)sVar6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_518);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_510);
    pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       (_height,(long)local_38c);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    NoRedVerifier::NoRedVerifier((NoRedVerifier *)&local_520);
    bVar2 = verifyImageWithVerifier(pvVar4,pTVar5,&local_520,false);
    local_29 = (local_29 & 1 & bVar2) != 0;
  }
  if ((local_29 & 1) == 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_6a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_6a0,
                        (char (*) [86])
                        "Could not get mask information from the rendered image, cannot continue verification."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6a0);
    this_local._7_1_ = false;
  }
  else {
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_numRequestedSamples == 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_820,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_820,(char (*) [38])"Verifying sample mask bit index is 0.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_820);
      pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[](_height,0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::Vector<float,_3>::Vector(&local_844,0.0,0.0,0.0);
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&errorMask.m_pixels.m_cap,0xff,8,0xff);
      ColorVerifier::ColorVerifier(&local_838,&local_844,(IVec3 *)&errorMask.m_pixels.m_cap);
      bVar2 = verifyImageWithVerifier(pvVar4,pTVar5,&local_838.super_Verifier,false);
      local_29 = (local_29 & 1 & bVar2) != 0;
    }
    else {
      tcu::Surface::Surface((Surface *)&printCount,iStack_24,local_28);
      bVar2 = true;
      local_870 = 0;
      maskBitIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 5;
      sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
      std::allocator<int>::allocator(&local_891);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_890,sVar6,&local_891);
      std::allocator<int>::~allocator(&local_891);
      tcu::Surface::getAccess(&local_8c0,(Surface *)&printCount);
      tcu::Vector<float,_4>::Vector(&local_8d0,0.0,1.0,0.0,1.0);
      tcu::clear(&local_8c0,&local_8d0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&x,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&x,
                          (char (*) [52])"Verifying per-invocation sample mask bit is unique.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
      for (iStack_a54 = 0; iStack_a54 < local_28; iStack_a54 = iStack_a54 + 1) {
        for (sampleNdx_2 = 0; sampleNdx_2 < iStack_24; sampleNdx_2 = sampleNdx_2 + 1) {
          color.m_value._3_1_ = 0;
          for (sampleNdxA = 0; iVar3 = sampleNdxA,
              sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
              iVar3 < (int)sVar6; sampleNdxA = sampleNdxA + 1) {
            pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                               (_height,(long)sampleNdxA);
            sampleNdxB = (int)tcu::Surface::getPixel(pvVar4,sampleNdx_2,iStack_a54);
            iVar3 = tcu::RGBA::getGreen((RGBA *)&sampleNdxB);
            fVar9 = deFloatRound(((float)iVar3 / 255.0) *
                                 (float)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase
                                        .super_MultisampleRenderCase.m_numTargetSamples);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_890,(long)sampleNdxA);
            *pvVar8 = (int)fVar9;
          }
          local_a68 = 0;
          while( true ) {
            iVar3 = local_a68;
            sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
            local_1189 = false;
            if (iVar3 < (int)sVar6) {
              local_1189 = (color.m_value._3_1_ & 1) == 0 || local_870 < 5;
            }
            iVar3 = local_a68;
            if (!local_1189) break;
            while( true ) {
              local_a6c = iVar3 + 1;
              iVar3 = local_a6c;
              sVar6 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
              local_1191 = false;
              if (iVar3 < (int)sVar6) {
                local_1191 = (color.m_value._3_1_ & 1) == 0 || local_870 < 5;
              }
              if (!local_1191) break;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_890,(long)local_a68);
              iVar1 = *pvVar8;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_890,(long)local_a6c);
              iVar3 = local_a6c;
              if (iVar1 == *pvVar8) {
                local_870 = local_870 + 1;
                if (local_870 < 6) {
                  pTVar5 = tcu::TestContext::getLog
                                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                      super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                      super_TestNode.m_testCtx);
                  tcu::TestLog::operator<<
                            (&local_bf0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar7 = tcu::MessageBuilder::operator<<(&local_bf0,(char (*) [8])"Pixel (");
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&sampleNdx_2);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xfffffffffffff5ac);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"): Samples ");
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a68);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])0x2b82e30);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a6c);
                  pMVar7 = tcu::MessageBuilder::operator<<
                                     (pMVar7,(char (*) [50])
                                             " have the same sample mask. (Single bit at index ");
                  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)local_890,(long)local_a68
                                     );
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar8);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_bf0);
                }
                iVar1 = iStack_a54;
                iVar3 = sampleNdx_2;
                color.m_value._3_1_ = 1;
                bVar2 = false;
                local_bf4 = (deUint32)tcu::RGBA::red();
                tcu::Surface::setPixel((Surface *)&printCount,iVar3,iVar1,(RGBA)local_bf4);
                iVar3 = local_a6c;
              }
            }
            local_a68 = local_a68 + 1;
          }
        }
      }
      if (!bVar2) {
        if (5 < local_870) {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                              super_MultisampleRenderCase.super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_d78,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_d78,(char (*) [5])0x2b66789);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])"Omitted ");
          local_d7c = local_870 + -5;
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_d7c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])0x2c3fe31);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_d78);
        }
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                            super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode
                            .m_testCtx);
        tcu::TestLog::operator<<(&local_f00,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_f00,(char (*) [27])"Image verification failed.");
        pTVar5 = tcu::MessageBuilder::operator<<
                           (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f60,"Verification",&local_f61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f88,"Image Verification",&local_f89);
        tcu::LogImageSet::LogImageSet(&local_f40,&local_f60,&local_f88);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_f40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1040,"ErrorMask",&local_1041);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1068,"Error Mask",&local_1069);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_1098,(Surface *)&printCount);
        tcu::LogImage::LogImage
                  (&local_1020,&local_1040,&local_1068,&local_1098,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_1020);
        tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_1020);
        std::__cxx11::string::~string((string *)&local_1068);
        std::allocator<char>::~allocator(&local_1069);
        std::__cxx11::string::~string((string *)&local_1040);
        std::allocator<char>::~allocator(&local_1041);
        tcu::LogImageSet::~LogImageSet(&local_f40);
        std::__cxx11::string::~string((string *)&local_f88);
        std::allocator<char>::~allocator(&local_f89);
        std::__cxx11::string::~string((string *)&local_f60);
        std::allocator<char>::~allocator(&local_f61);
        tcu::MessageBuilder::~MessageBuilder(&local_f00);
        local_29 = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_890);
      tcu::Surface::~Surface((Surface *)&printCount);
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SampleMaskUniqueCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;

	// Log samples
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// check for earlier errors (in fragment shader)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying fragment shader invocation found only one set sample mask bit." << tcu::TestLog::EndMessage;

		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			allOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!allOk)
		{
			// can't check the uniqueness if the masks don't work at all
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not get mask information from the rendered image, cannot continue verification." << tcu::TestLog::EndMessage;
			return false;
		}
	}

	// verify index / index ranges

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect index=0

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask bit index is 0." << tcu::TestLog::EndMessage;

		// only check the mask index
		allOk &= verifyImageWithVerifier(resultBuffers[0], m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::IVec3(255, 8, 255)), false);
	}
	else
	{
		// check uniqueness

		tcu::Surface		errorMask		(width, height);
		bool				uniquenessOk	= true;
		int					printCount		= 0;
		const int			printFloodLimit	= 5;
		std::vector<int>	maskBitIndices	(resultBuffers.size());

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying per-invocation sample mask bit is unique." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool maskNdxNotUnique = false;

			// decode index
			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				maskBitIndices[sampleNdx] = (int)deFloatRound((float)color.getGreen() / 255.0f * (float)m_numTargetSamples);
			}

			// just check there are no two invocations with the same bit index
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (maskBitIndices[sampleNdxA] == maskBitIndices[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same sample mask. (Single bit at index " << maskBitIndices[sampleNdxA] << ")"
							<< tcu::TestLog::EndMessage;
					}

					maskNdxNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	return allOk;
}